

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int eatmdone(void)

{
  if (eatmbuf != (char *)0x0) {
    if (nomovemsg == eatmbuf) {
      nomovemsg = (char *)0x0;
    }
    free(eatmbuf);
    eatmbuf = (char *)0x0;
  }
  if (youmonst.m_ap_type != '\0') {
    youmonst.m_ap_type = '\0';
    newsym((int)u.ux,(int)u.uy);
  }
  return 0;
}

Assistant:

static int eatmdone(void)	/* called after mimicing is over */
{
	/* release `eatmbuf' */
	if (eatmbuf) {
	    if (nomovemsg == eatmbuf) nomovemsg = 0;
	    free(eatmbuf),  eatmbuf = 0;
	}
	/* update display */
	if (youmonst.m_ap_type) {
	    youmonst.m_ap_type = M_AP_NOTHING;
	    newsym(u.ux,u.uy);
	}
	return 0;
}